

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_INDEX_ii(DisasContext_conflict1 *s,arg_INDEX_ii *a)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  undefined1 extraout_AL;
  TCGv_i64 incr;
  TCGv_i64 pTVar2;
  uintptr_t o;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    incr = tcg_const_i64_aarch64(tcg_ctx,(long)a->imm1);
    pTVar2 = tcg_const_i64_aarch64(tcg_ctx,(long)a->imm2);
    do_index((DisasContext_conflict1 *)(ulong)(uint)s->sve_len,(int)s->uc->tcg_ctx,a->esz,
             (TCGv_i64)(ulong)(uint)a->rd,incr);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(incr + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    return (_Bool)extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool trans_INDEX_ii(DisasContext *s, arg_INDEX_ii *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        TCGv_i64 start = tcg_const_i64(tcg_ctx, a->imm1);
        TCGv_i64 incr = tcg_const_i64(tcg_ctx, a->imm2);
        do_index(s, a->esz, a->rd, start, incr);
        tcg_temp_free_i64(tcg_ctx, start);
        tcg_temp_free_i64(tcg_ctx, incr);
    }
    return true;
}